

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void decode_reconstruct_tx
               (AV1_COMMON *cm,ThreadData *td,aom_reader *r,MB_MODE_INFO *mbmi,int plane,
               BLOCK_SIZE plane_bsize,int blk_row,int blk_col,int block,TX_SIZE tx_size,
               int *eob_total)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  
  if (plane == 0) {
    bVar4 = mbmi->inter_tx_size
            [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[plane_bsize] & 0x1f)) +
             ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[plane_bsize] & 0x1f)) <<
             (av1_get_txb_size_index_stride_log2_table[plane_bsize] & 0x1f))];
  }
  else {
    bVar1 = ""[av1_ss_size_lookup[mbmi->bsize][(td->dcb).xd.plane[plane].subsampling_x]
               [(td->dcb).xd.plane[plane].subsampling_y]];
    if (bVar1 < 0x11) {
      bVar4 = 3;
      if ((1 < bVar1 - 0xb) && (bVar1 != 4)) {
        bVar4 = bVar1;
      }
    }
    else if (bVar1 == 0x11) {
      bVar4 = 9;
    }
    else {
      bVar4 = bVar1;
      if (bVar1 == 0x12) {
        bVar4 = 10;
      }
    }
  }
  uVar9 = (uint)block_size_high[plane_bsize];
  iVar10 = (td->dcb).xd.mb_to_bottom_edge;
  if (iVar10 < 0) {
    uVar9 = (uint)block_size_high[plane_bsize] +
            (iVar10 >> ((char)(td->dcb).xd.plane[plane].subsampling_y + 3U & 0x1f));
  }
  uVar7 = (uint)block_size_wide[plane_bsize];
  iVar10 = (td->dcb).xd.mb_to_right_edge;
  if (iVar10 < 0) {
    uVar7 = (uint)block_size_wide[plane_bsize] +
            (iVar10 >> ((char)(td->dcb).xd.plane[plane].subsampling_x + 3U & 0x1f));
  }
  iVar10 = ((int)uVar9 >> 2) - blk_row;
  if ((iVar10 != 0 && blk_row <= (int)uVar9 >> 2) &&
     (iVar8 = ((int)uVar7 >> 2) - blk_col, iVar8 != 0 && blk_col <= (int)uVar7 >> 2)) {
    if ((plane == 0) && (bVar4 != tx_size)) {
      iVar2 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
      if (iVar2 < iVar10) {
        iVar10 = iVar2;
      }
      iVar2 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
      if (iVar2 < iVar8) {
        iVar8 = iVar2;
      }
      if (0 < iVar10) {
        bVar4 = ""[tx_size];
        iVar2 = tx_size_wide_unit[bVar4];
        iVar3 = tx_size_high_unit[bVar4];
        iVar6 = 0;
        do {
          if (0 < iVar8) {
            iVar11 = 0;
            do {
              decode_reconstruct_tx
                        (cm,td,r,mbmi,0,plane_bsize,blk_row + iVar6,iVar11 + blk_col,block,bVar4,
                         eob_total);
              block = block + iVar3 * iVar2;
              iVar11 = iVar11 + iVar2;
            } while (iVar11 < iVar8);
          }
          iVar6 = iVar6 + iVar3;
        } while (iVar6 < iVar10);
      }
    }
    else {
      (*td->read_coeffs_tx_inter_block_visit)(cm,&td->dcb,r,plane,blk_row,blk_col,tx_size);
      (*td->inverse_tx_inter_block_visit)(cm,&td->dcb,r,plane,blk_row,blk_col,tx_size);
      *eob_total = *eob_total + (uint)(td->dcb).eob_data[plane][(td->dcb).txb_offset[plane]].eob;
      uVar5 = (short)tx_size_high[tx_size] * (short)tx_size_wide[tx_size] +
              (td->dcb).cb_offset[plane];
      (td->dcb).cb_offset[plane] = uVar5;
      (td->dcb).txb_offset[plane] = uVar5 >> 4;
    }
  }
  return;
}

Assistant:

static inline void decode_reconstruct_tx(AV1_COMMON *cm, ThreadData *const td,
                                         aom_reader *r,
                                         MB_MODE_INFO *const mbmi, int plane,
                                         BLOCK_SIZE plane_bsize, int blk_row,
                                         int blk_col, int block,
                                         TX_SIZE tx_size, int *eob_total) {
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];
  // Scale to match transform block unit.
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (tx_size == plane_tx_size || plane) {
    td->read_coeffs_tx_inter_block_visit(cm, dcb, r, plane, blk_row, blk_col,
                                         tx_size);

    td->inverse_tx_inter_block_visit(cm, dcb, r, plane, blk_row, blk_col,
                                     tx_size);
    eob_info *eob_data = dcb->eob_data[plane] + dcb->txb_offset[plane];
    *eob_total += eob_data->eob;
    set_cb_buffer_offsets(dcb, tx_size, plane);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    assert(IMPLIES(tx_size <= TX_4X4, sub_txs == tx_size));
    assert(IMPLIES(tx_size > TX_4X4, sub_txs < tx_size));
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int sub_step = bsw * bsh;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);

    assert(bsw > 0 && bsh > 0);

    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;

        decode_reconstruct_tx(cm, td, r, mbmi, plane, plane_bsize, offsetr,
                              offsetc, block, sub_txs, eob_total);
        block += sub_step;
      }
    }
  }
}